

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall ON_PolyCurve::SpanCount(ON_PolyCurve *this)

{
  int iVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  int local_24;
  int j;
  int i;
  int segment_count;
  int span_count;
  ON_PolyCurve *this_local;
  
  i = 0;
  iVar1 = Count(this);
  local_24 = 0;
  while( true ) {
    if (iVar1 <= local_24) {
      return i;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_24);
    if (*ppOVar3 == (ON_Curve *)0x0) break;
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_24);
    iVar2 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])();
    if (iVar2 == 0) {
      return 0;
    }
    i = iVar2 + i;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int ON_PolyCurve::SpanCount() const
{
  int span_count = 0;
  const int segment_count = Count();
  int i, j;
  for ( i = 0; i < segment_count; i++  ) {
    if ( !m_segment[i] )
      return false;
    j = m_segment[i]->SpanCount();
    if ( j == 0 )
      return 0;
    span_count += j;
  }
  return span_count;
}